

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_state.cpp
# Opt level: O2

void __thiscall duckdb::CleanupState::CleanupDelete(CleanupState *this,DeleteInfo *info)

{
  ushort uVar1;
  idx_t iVar2;
  idx_t iVar3;
  bool bVar4;
  idx_t i;
  DataTable *pDVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  uint16_t *puVar8;
  idx_t i_1;
  string local_40;
  
  pDVar5 = info->table;
  bVar4 = DataTable::HasIndexes(pDVar5);
  if (bVar4) {
    if ((this->current_table).ptr != pDVar5) {
      Flush(this);
      (this->current_table).ptr = pDVar5;
    }
    pDVar5 = optional_ptr<duckdb::DataTable,_true>::operator->(&this->current_table);
    DataTable::GetTableName_abi_cxx11_(&local_40,pDVar5);
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::optional_ptr<duckdb::DataTable,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,&local_40);
    pmVar6->ptr = (this->current_table).ptr;
    ::std::__cxx11::string::~string((string *)&local_40);
    this->count = 0;
    if (info->is_consecutive == true) {
      for (uVar7 = 0; uVar7 < info->count; uVar7 = uVar7 + 1) {
        iVar2 = info->base_row;
        iVar3 = this->count;
        this->count = iVar3 + 1;
        this->row_numbers[iVar3] = iVar2 + uVar7;
      }
    }
    else {
      puVar8 = DeleteInfo::GetRows(info);
      for (uVar7 = 0; uVar7 < info->count; uVar7 = uVar7 + 1) {
        uVar1 = puVar8[uVar7];
        iVar2 = info->base_row;
        iVar3 = this->count;
        this->count = iVar3 + 1;
        this->row_numbers[iVar3] = uVar1 + iVar2;
      }
    }
    Flush(this);
  }
  return;
}

Assistant:

void CleanupState::CleanupDelete(DeleteInfo &info) {
	auto version_table = info.table;
	if (!version_table->HasIndexes()) {
		// this table has no indexes: no cleanup to be done
		return;
	}

	if (current_table != version_table) {
		// table for this entry differs from previous table: flush and switch to the new table
		Flush();
		current_table = version_table;
	}

	// possibly vacuum any indexes in this table later
	indexed_tables[current_table->GetTableName()] = current_table;

	count = 0;
	if (info.is_consecutive) {
		for (idx_t i = 0; i < info.count; i++) {
			row_numbers[count++] = UnsafeNumericCast<int64_t>(info.base_row + i);
		}
	} else {
		auto rows = info.GetRows();
		for (idx_t i = 0; i < info.count; i++) {
			row_numbers[count++] = UnsafeNumericCast<int64_t>(info.base_row + rows[i]);
		}
	}
	Flush();
}